

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_current.cpp
# Opt level: O0

int cpptrace::detail::get_page_protections(void *page)

{
  byte bVar1;
  istream *piVar2;
  long lVar3;
  runtime_error *prVar4;
  uint local_248;
  char local_243;
  char local_242;
  char local_241;
  int perms;
  char x;
  char w;
  char r;
  uintptr_t stop;
  uintptr_t start;
  istream local_220 [8];
  ifstream stream;
  uintptr_t page_addr;
  void *page_local;
  
  std::ifstream::ifstream(local_220,"/proc/self/maps",_S_in);
  std::istream::operator>>(local_220,std::hex);
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::istream::operator>>(local_220,&stop);
    std::istream::ignore((long)local_220);
    std::istream::operator>>(local_220,(ulong *)&perms);
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) != 0) break;
    bVar1 = std::ios::fail();
    if ((bVar1 & 1) != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Failure reading /proc/self/maps");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((stop <= page) && (page < _perms)) {
      std::istream::ignore((long)local_220);
      piVar2 = std::operator>>(local_220,&local_241);
      piVar2 = std::operator>>(piVar2,&local_242);
      std::operator>>(piVar2,&local_243);
      bVar1 = std::ios::fail();
      if (((bVar1 & 1) == 0) && (bVar1 = std::ios::eof(), (bVar1 & 1) == 0)) {
        local_248 = (uint)(local_241 == 'r');
        if (local_242 == 'w') {
          local_248 = local_248 | 2;
        }
        if (local_243 == 'x') {
          local_248 = local_248 | 4;
        }
        std::ifstream::~ifstream(local_220);
        return local_248;
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Failure reading /proc/self/maps");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar3 = std::numeric_limits<long>::max();
    std::istream::ignore((long)local_220,(int)lVar3);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Failed to find mapping with page in /proc/self/maps");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int get_page_protections(void* page) {
            auto page_addr = reinterpret_cast<uintptr_t>(page);
            std::ifstream stream("/proc/self/maps");
            stream>>std::hex;
            while(!stream.eof()) {
                uintptr_t start;
                uintptr_t stop;
                stream>>start;
                stream.ignore(1); // dash
                stream>>stop;
                if(stream.eof()) {
                    break;
                }
                if(stream.fail()) {
                    throw std::runtime_error("Failure reading /proc/self/maps");
                }
                if(page_addr >= start && page_addr < stop) {
                    stream.ignore(1); // space
                    char r, w, x; // there's a private/shared flag after these but we don't need it
                    stream>>r>>w>>x;
                    if(stream.fail() || stream.eof()) {
                        throw std::runtime_error("Failure reading /proc/self/maps");
                    }
                    int perms = 0;
                    if(r == 'r') {
                        perms |= PROT_READ;
                    }
                    if(w == 'w') {
                        perms |= PROT_WRITE;
                    }
                    if(x == 'x') {
                        perms |= PROT_EXEC;
                    }
                    // std::cerr<<"--parsed: "<<std::hex<<start<<" "<<stop<<" "<<r<<w<<x<<std::endl;
                    return perms;
                }
                stream.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
            }
            throw std::runtime_error("Failed to find mapping with page in /proc/self/maps");
        }